

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O0

string * flow::disassemble(string *__return_storage_ptr__,Instruction *program,size_t n,
                          string *indent,ConstantPool *cp)

{
  size_t pc_00;
  int iVar1;
  ConstantPool *in_R9;
  string local_200;
  Instruction *local_1d0;
  Instruction *pc;
  size_t sp;
  size_t i;
  stringstream result;
  ostream local_1a8 [376];
  ConstantPool *local_30;
  ConstantPool *cp_local;
  string *indent_local;
  size_t n_local;
  Instruction *program_local;
  
  local_30 = cp;
  cp_local = (ConstantPool *)indent;
  indent_local = (string *)n;
  n_local = (size_t)program;
  program_local = (Instruction *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  sp = 0;
  pc = (Instruction *)0x0;
  for (local_1d0 = (Instruction *)n_local;
      local_1d0 < (Instruction *)(n_local + (long)indent_local * 8); local_1d0 = local_1d0 + 1) {
    std::operator<<(local_1a8,(string *)cp_local);
    pc_00 = sp;
    sp = sp + 1;
    disassemble_abi_cxx11_(&local_200,(flow *)*local_1d0,pc_00,(size_t)pc,(size_t)local_30,in_R9);
    std::operator<<(local_1a8,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::operator<<(local_1a8,'\n');
    iVar1 = getStackChange(*local_1d0);
    pc = (Instruction *)((long)iVar1 + (long)pc);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string disassemble(const Instruction* program,
                        size_t n,
                        const std::string& indent,
                        const ConstantPool* cp) {
  std::stringstream result;
  size_t i = 0;
  size_t sp = 0;
  for (const Instruction* pc = program; pc < program + n; ++pc) {
    result << indent;
    result << disassemble(*pc, i++, sp, cp);
    result << '\n';
    sp += getStackChange(*pc);
  }
  return result.str();
}